

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlDebugDumpDTD(FILE *output,xmlDtdPtr dtd)

{
  size_t __size;
  char *__ptr;
  xmlDebugCtxt local_b8;
  
  if (output == (FILE *)0x0) {
    output = (FILE *)_stdout;
  }
  xmlCtxtDumpInitCtxt(&local_b8);
  local_b8.options._0_1_ = (byte)local_b8.options | 1;
  local_b8.output = output;
  if (dtd == (xmlDtdPtr)0x0) {
    if (local_b8.check == 0) {
      __ptr = "DTD is NULL\n";
      __size = 0xc;
      goto LAB_0013e36d;
    }
  }
  else {
    xmlCtxtDumpDtdNode(&local_b8,dtd);
    if (dtd->children == (xmlNodePtr)0x0) {
      __ptr = "    DTD is empty\n";
      __size = 0x11;
LAB_0013e36d:
      fwrite(__ptr,__size,1,(FILE *)local_b8.output);
      return;
    }
    local_b8.depth = local_b8.depth + 1;
    xmlCtxtDumpNodeList(&local_b8,dtd->children);
  }
  return;
}

Assistant:

void
xmlDebugDumpDTD(FILE * output, xmlDtdPtr dtd)
{
    xmlDebugCtxt ctxt;

    if (output == NULL)
	output = stdout;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.options |= DUMP_TEXT_TYPE;
    ctxt.output = output;
    xmlCtxtDumpDTD(&ctxt, dtd);
    xmlCtxtDumpCleanCtxt(&ctxt);
}